

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

avector<Vec3ff> * __thiscall
embree::XMLLoader::loadVec3ffArray
          (avector<Vec3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pTVar1;
  pointer pTVar2;
  int iVar3;
  long lVar4;
  size_t *psVar5;
  runtime_error *this_01;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  Vec3fx *local_b8;
  string local_a8;
  string local_88;
  float local_68;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fx *)0x0;
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ofs","");
    XML::parm(&local_88,this_00,&local_a8);
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (iVar3 == 0) {
      psVar5 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fx *)0x0;
      pTVar1 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pTVar2 - (long)pTVar1 >> 3;
      uVar9 = lVar4 * -0x71c71c71c71c71c7;
      if ((uVar9 & 3) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_a8,&xml->ptr->loc);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_88._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar7) {
          local_88.field_2._M_allocated_capacity = *psVar7;
          local_88.field_2._8_8_ = plVar6[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar7;
        }
        local_88._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_88);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar9 = uVar9 >> 2;
      if (pTVar2 == pTVar1) {
        local_b8 = (Vec3fx *)0x0;
      }
      else {
        local_b8 = (Vec3fx *)alignedMalloc(lVar4 * 0x38e38e38e38e38e4,0x10);
        __return_storage_ptr__->items = local_b8;
        alignedFree((void *)0x0);
        *psVar5 = uVar9;
        psVar5 = &__return_storage_ptr__->size_alloced;
      }
      *psVar5 = uVar9;
      if (pTVar2 != pTVar1) {
        lVar4 = 0;
        uVar8 = 0;
        do {
          local_48 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                                                                        
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                           lVar4),true);
          local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].ty +
                                           lVar4),true);
          local_68 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ty +
                                           lVar4),true);
          fVar10 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[3].ty +
                                         lVar4),true);
          (local_b8->field_0).m128[0] = local_48;
          (local_b8->field_0).m128[1] = local_58;
          (local_b8->field_0).m128[2] = local_68;
          (local_b8->field_0).m128[3] = fVar10;
          uVar8 = uVar8 + 1;
          lVar4 = lVar4 + 0x120;
          local_b8 = local_b8 + 1;
        } while (uVar8 < uVar9);
      }
    }
    else {
      loadBinary<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                (__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3ff> XMLLoader::loadVec3ffArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3ff>();

    if (xml->parm("ofs") != "") {
      return loadBinary<avector<Vec3ff>>(xml);
    } 
    else 
    {
      avector<Vec3ff> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3ff(xml->body[4*i+0].Float(),xml->body[4*i+1].Float(),xml->body[4*i+2].Float(),xml->body[4*i+3].Float());
      return data;
    }
  }